

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmValue __thiscall
cmGeneratorTarget::GetPropertyWithPairedLanguageSupport
          (cmGeneratorTarget *this,string *lang,char *suffix)

{
  cmTarget *this_00;
  int iVar1;
  cmValue cVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_80;
  char *local_60;
  undefined8 local_58;
  string local_50;
  
  this_00 = this->Target;
  local_80._M_string_length = (size_type)(lang->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)lang->_M_string_length;
  local_80.field_2._M_allocated_capacity = 0;
  local_80.field_2._8_8_ = strlen(suffix);
  local_58 = 0;
  views._M_len = 2;
  views._M_array = (iterator)&local_80;
  local_60 = suffix;
  cmCatViews(&local_50,views);
  cVar2 = cmTarget::GetProperty(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (cVar2.Value == (string *)0x0) {
    iVar1 = std::__cxx11::string::compare((char *)lang);
    if (iVar1 == 0) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"C","");
      cVar2 = GetPropertyWithPairedLanguageSupport(this,&local_80,suffix);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)lang);
      if (((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)lang), iVar1 != 0)) &&
         (iVar1 = std::__cxx11::string::compare((char *)lang), iVar1 != 0)) {
        return (cmValue)(string *)0x0;
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"CXX","");
      cVar2 = GetPropertyWithPairedLanguageSupport(this,&local_80,suffix);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return (cmValue)cVar2.Value;
}

Assistant:

cmValue cmGeneratorTarget::GetPropertyWithPairedLanguageSupport(
  std::string const& lang, const char* suffix) const
{
  cmValue propertyValue = this->Target->GetProperty(cmStrCat(lang, suffix));
  if (!propertyValue) {
    // Check if we should use the value set by another language.
    if (lang == "OBJC") {
      propertyValue = this->GetPropertyWithPairedLanguageSupport("C", suffix);
    } else if (lang == "OBJCXX" || lang == "CUDA" || lang == "HIP") {
      propertyValue =
        this->GetPropertyWithPairedLanguageSupport("CXX", suffix);
    }
  }
  return propertyValue;
}